

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O0

int use_saddle(obj *otmp)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  byte bVar4;
  boolean bVar5;
  schar sVar6;
  schar sVar7;
  int iVar8;
  char *pcVar9;
  obj *poVar10;
  monst *local_250;
  char local_248 [8];
  char kbuf_1 [256];
  char kbuf [256];
  schar local_3b;
  char local_3a;
  char local_39;
  schar dz;
  schar dy;
  char *pcStack_38;
  schar dx;
  char *s;
  long lStack_28;
  int chance;
  permonst *ptr;
  monst *mtmp;
  obj *otmp_local;
  
  mtmp = (monst *)otmp;
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pline("You have no hands!");
    return 0;
  }
  iVar8 = freehand();
  if (iVar8 == 0) {
    pcVar9 = body_part(6);
    pline("You have no free %s.",pcVar9);
    return 0;
  }
  if ((((u._1052_1_ & 1) != 0) || (((byte)u._1052_1_ >> 1 & 1) != 0)) ||
     (iVar8 = getdir((char *)0x0,&local_39,&local_3a,&local_3b), iVar8 == 0)) {
    pline("Never mind.");
    return 0;
  }
  if ((local_39 == '\0') && (local_3a == '\0')) {
    pline("Saddle yourself?  Very funny...");
    return 0;
  }
  if ((((int)u.ux + (int)local_39 < 1) || (0x4f < (int)u.ux + (int)local_39)) ||
     (((int)u.uy + (int)local_3a < 0 || (0x14 < (int)u.uy + (int)local_3a)))) goto LAB_002f415f;
  if ((level->monsters[(int)u.ux + (int)local_39][(int)u.uy + (int)local_3a] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[(int)u.ux + (int)local_39][(int)u.uy + (int)local_3a]->field_0x60
       >> 9 & 1) != 0)) {
    local_250 = (monst *)0x0;
  }
  else {
    local_250 = level->monsters[(int)u.ux + (int)local_39][(int)u.uy + (int)local_3a];
  }
  ptr = (permonst *)local_250;
  if (local_250 == (monst *)0x0) goto LAB_002f415f;
  if (local_250->wormno == '\0') {
    if ((viz_array[local_250->my][local_250->mx] & 2U) != 0) goto LAB_002f3f0f;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((local_250->data->mflags3 & 0x200) != 0)))) {
      bVar4 = viz_array[local_250->my][local_250->mx] & 1;
      goto joined_r0x002f3f09;
    }
  }
  else {
    bVar4 = worm_known(level,local_250);
joined_r0x002f3f09:
    if (bVar4 != 0) {
LAB_002f3f0f:
      if ((((((((uint)ptr[1].mattk[4] >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
          ((((uint)ptr[1].mattk[4] >> 7 & 1) == 0 && (((uint)ptr[1].mattk[4] >> 9 & 1) == 0)))) &&
         (((byte)u._1052_1_ >> 5 & 1) == 0)) goto LAB_002f4179;
    }
  }
  if (((((*(uint *)(*(long *)&ptr->mlet + 0x30) & 0x10000) != 0) ||
       ((poVar10 = which_armor((monst *)ptr,4), poVar10 != (obj *)0x0 &&
        (poVar10 = which_armor((monst *)ptr,4), poVar10->otyp == 0x4f)))) ||
      (((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((u.uprops[0x19].intrinsic == 0 &&
             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
        (u.uprops[0x19].blocked != 0)) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar8 = dist2((int)*(char *)((long)&ptr[1].geno + 1),(int)(char)ptr[1].mattk[0].aatyp,
                       (int)u.ux,(int)u.uy), 0x40 < iVar8)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar5 = match_warn_of_mon((monst *)ptr), bVar5 == '\0')))) {
LAB_002f415f:
    pline("I see nobody there.");
    return 0;
  }
LAB_002f4179:
  uVar1._0_2_ = ptr[1].cwt;
  uVar1._2_2_ = ptr[1].cnutrit;
  if (((uVar1 & 0x100000) != 0) ||
     (poVar10 = which_armor((monst *)ptr,0x100000), poVar10 != (obj *)0x0)) {
    pcVar9 = Monnam((monst *)ptr);
    pline("%s doesn\'t need another one.",pcVar9);
    return 0;
  }
  lStack_28._0_1_ = ptr->mlet;
  lStack_28._1_1_ = ptr->mlevel;
  lStack_28._2_1_ = ptr->mmove;
  lStack_28._3_1_ = ptr->ac;
  lStack_28._4_1_ = ptr->mr;
  lStack_28._5_1_ = ptr->maligntyp;
  lStack_28._6_2_ = ptr->geno;
  if ((((lStack_28 == 0x3c0190) || (lStack_28 == 0x3c0150)) && (uarmg == (obj *)0x0)) &&
     ((u.uprops[8].extrinsic == 0 && ((youmonst.mintrinsics & 0x80) == 0)))) {
    pcVar9 = mon_nam((monst *)ptr);
    pline("You touch %s.",pcVar9);
    pcVar9 = mons_mname(*(permonst **)&ptr->mlet);
    pcVar9 = an(pcVar9);
    sprintf(kbuf_1 + 0xf8,"attempting to saddle %s",pcVar9);
    bVar5 = delayed_petrify((char *)0x0,kbuf_1 + 0xf8);
    if (bVar5 != '\0') {
      pline("You stop your saddling attempt.");
      return 1;
    }
  }
  if (lStack_28 == 0x3c3550) {
    if (((objects[*(short *)((long)&mtmp->m_id + 2)].oc_oprop != '\x04') &&
        (bVar5 = obj_resists((obj *)mtmp,5,0x32), bVar5 == '\0')) &&
       (bVar5 = is_quest_artifact((obj *)mtmp), bVar5 == '\0')) {
      pcVar9 = Yname2((obj *)mtmp);
      pline("%s disintegrates!",pcVar9);
      useup((obj *)mtmp);
    }
    pcVar9 = a_monnam((monst *)ptr);
    sprintf(local_248,"attempting to saddle %s",pcVar9);
    instadisintegrate(local_248);
  }
  if ((lStack_28 != 0x3c4a90) && (lStack_28 != 0x3c4a50)) {
    if (((((uint)ptr[1].mattk[4] >> 0x1a & 1) == 0) &&
        (((((uint)ptr[1].mattk[4] >> 0x19 & 1) == 0 && (((uint)ptr[1].mattk[4] >> 0x1c & 1) == 0))
         && (((uint)ptr[1].mattk[4] >> 0x1b & 1) == 0)))) &&
       (((uint)ptr[1].mattk[4] >> 0x1d & 1) == 0)) {
      bVar5 = can_saddle((monst *)ptr);
      if (bVar5 == '\0') {
        pline("You can\'t saddle such a creature.");
        return 0;
      }
      sVar6 = acurr(3);
      sVar7 = acurr(5);
      iVar8 = 5;
      if (ptr[1].mattk[2].aatyp != '\0') {
        iVar8 = 0x14;
      }
      s._4_4_ = u.ulevel * iVar8 + (int)sVar6 + (int)sVar7 / 2 + (char)ptr[1].mattk[2].aatyp * 2;
      if (ptr[1].mattk[2].aatyp == '\0') {
        s._4_4_ = s._4_4_ + (uint)(byte)ptr[1].geno * -10;
      }
      if (urole.malenum == 0x15f) {
        s._4_4_ = s._4_4_ + 0x14;
      }
      switch(u.weapon_skills[0x27].skill) {
      case '\0':
      case '\x01':
      default:
        s._4_4_ = s._4_4_ + -0x14;
        break;
      case '\x02':
        break;
      case '\x03':
        s._4_4_ = s._4_4_ + 0xf;
        break;
      case '\x04':
        s._4_4_ = s._4_4_ + 0x1e;
      }
      if (((u.uprops[0x1c].intrinsic == 0) && (u.uprops[0x25].intrinsic == 0)) &&
         ((u.uprops[0x25].extrinsic == 0 && (u.uprops[0x29].intrinsic == 0)))) {
        if (((uarmg == (obj *)0x0) ||
            (pcStack_38 = obj_descr[objects[uarmg->otyp].oc_descr_idx].oc_descr,
            pcStack_38 == (char *)0x0)) || (iVar8 = strncmp(pcStack_38,"riding ",7), iVar8 != 0)) {
          if (((uarmf != (obj *)0x0) &&
              (pcStack_38 = obj_descr[objects[uarmf->otyp].oc_descr_idx].oc_descr,
              pcStack_38 != (char *)0x0)) && (iVar8 = strncmp(pcStack_38,"riding ",7), iVar8 == 0))
          {
            s._4_4_ = s._4_4_ + 10;
          }
        }
        else {
          s._4_4_ = s._4_4_ + 10;
        }
      }
      else {
        s._4_4_ = s._4_4_ + -0x14;
      }
      if ((*(uint *)(mtmp->mtrack + 3) & 1) != 0) {
        s._4_4_ = s._4_4_ + -0x32;
      }
      iVar8 = rn2(100);
      if (iVar8 < s._4_4_) {
        mon_nam((monst *)ptr);
        pline("You put the saddle on %s.");
        if (*(int *)&mtmp->field_0x60 != 0) {
          remove_worn_item((obj *)mtmp,'\0');
        }
        freeinv((obj *)mtmp);
        mpickobj((monst *)ptr,(obj *)mtmp);
        uVar2._0_2_ = ptr[1].cwt;
        uVar2._2_2_ = ptr[1].cnutrit;
        ptr[1].cwt = (short)(uVar2 | 0x100000);
        ptr[1].cnutrit = (short)((uVar2 | 0x100000) >> 0x10);
        *(undefined4 *)&mtmp->field_0x60 = 0x100000;
        uVar3._0_2_ = ptr->cwt;
        uVar3._2_2_ = ptr->cnutrit;
        mtmp->my = (char)(undefined2)uVar3;
        mtmp->mux = (char)((uint)uVar3 >> 8);
        mtmp->muy = (char)((uint)uVar3 >> 0x10);
        mtmp->malign = (char)((uint)uVar3 >> 0x18);
        update_mon_intrinsics(level,(monst *)ptr,(obj *)mtmp,'\x01','\0');
      }
      else {
        pcVar9 = Monnam((monst *)ptr);
        pline("%s resists!",pcVar9);
      }
      return 1;
    }
    pcVar9 = mon_nam((monst *)ptr);
    pline("I think %s would mind.",pcVar9);
    return 0;
  }
  pline("Shame on you!");
  exercise(2,'\0');
  return 1;
}

Assistant:

int use_saddle(struct obj *otmp)
{
	struct monst *mtmp;
	const struct permonst *ptr;
	int chance;
	const char *s;
	schar dx, dy, dz;

	/* Can you use it? */
	if (nohands(youmonst.data)) {
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}

	/* Select an animal */
	if (u.uswallow || Underwater || !getdir(NULL, &dx, &dy, &dz)) {
	    pline("Never mind.");
	    return 0;
	}
	if (!dx && !dy) {
	    pline("Saddle yourself?  Very funny...");
	    return 0;
	}
	if (!isok(u.ux+dx, u.uy+dy) ||
			!(mtmp = m_at(level, u.ux+dx, u.uy+dy)) ||
			!canspotmon(level, mtmp)) {
	    pline("I see nobody there.");
	    return 0;
	}

	/* Is this a valid monster? */
	if (mtmp->misc_worn_check & W_SADDLE ||
			which_armor(mtmp, W_SADDLE)) {
	    pline("%s doesn't need another one.", Monnam(mtmp));
	    return 0;
	}
	ptr = mtmp->data;
	if (touch_petrifies(ptr) && !uarmg && !Stone_resistance) {
	    char kbuf[BUFSZ];

	    pline("You touch %s.", mon_nam(mtmp));
	    sprintf(kbuf, "attempting to saddle %s", an(mons_mname(mtmp->data)));
	    if (delayed_petrify(NULL, kbuf)) {
		pline("You stop your saddling attempt.");
		return 1;
	    }
	}
	if (touch_disintegrates(ptr)) {
	    char kbuf[BUFSZ];
	    if (!oresist_disintegration(otmp)) {
		pline("%s disintegrates!", Yname2(otmp));
		useup(otmp);
	    }
	    sprintf(kbuf, "attempting to saddle %s", a_monnam(mtmp));
	    instadisintegrate(kbuf);
	}
	if (ptr == &mons[PM_INCUBUS] || ptr == &mons[PM_SUCCUBUS]) {
	    pline("Shame on you!");
	    exercise(A_WIS, FALSE);
	    return 1;
	}
	if (mtmp->isminion || mtmp->isshk || mtmp->ispriest ||
			mtmp->isgd || mtmp->iswiz) {
	    pline("I think %s would mind.", mon_nam(mtmp));
	    return 0;
	}
	if (!can_saddle(mtmp)) {
	    pline("You can't saddle such a creature.");
	    return 0;
	}

	/* Calculate your chance */
	chance = ACURR(A_DEX) + ACURR(A_CHA)/2 + 2*mtmp->mtame;
	chance += u.ulevel * (mtmp->mtame ? 20 : 5);
	if (!mtmp->mtame) chance -= 10*mtmp->m_lev;
	if (Role_if (PM_KNIGHT))
	    chance += 20;
	switch (P_SKILL(P_RIDING)) {
	case P_ISRESTRICTED:
	case P_UNSKILLED:
	default:
	    chance -= 20;	break;
	case P_BASIC:
	    break;
	case P_SKILLED:
	    chance += 15;	break;
	case P_EXPERT:
	    chance += 30;	break;
	}
	if (Confusion || Fumbling || Glib)
	    chance -= 20;
	else if (uarmg &&
		(s = OBJ_DESCR(objects[uarmg->otyp])) != NULL &&
		!strncmp(s, "riding ", 7))
	    /* Bonus for wearing "riding" (but not fumbling) gloves */
	    chance += 10;
	else if (uarmf &&
		(s = OBJ_DESCR(objects[uarmf->otyp])) != NULL &&
		!strncmp(s, "riding ", 7))
	    /* ... or for "riding boots" */
	    chance += 10;
	if (otmp->cursed)
	    chance -= 50;

	/* Make the attempt */
	if (rn2(100) < chance) {
	    pline("You put the saddle on %s.", mon_nam(mtmp));
	    if (otmp->owornmask) remove_worn_item(otmp, FALSE);
	    freeinv(otmp);
	    /* mpickobj may free otmp it if merges, but we have already
	       checked for a saddle above, so no merger should happen */
	    mpickobj(mtmp, otmp);
	    mtmp->misc_worn_check |= W_SADDLE;
	    otmp->owornmask = W_SADDLE;
	    otmp->leashmon = mtmp->m_id;
	    update_mon_intrinsics(level, mtmp, otmp, TRUE, FALSE);
	} else
	    pline("%s resists!", Monnam(mtmp));
	return 1;
}